

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_util.hpp
# Opt level: O2

string * __thiscall
duckdb::StringUtil::Format<std::__cxx11::string,char_const*>
          (string *__return_storage_ptr__,StringUtil *this,string *fmt_str,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params,char *params_1)

{
  string local_40;
  
  ::std::__cxx11::string::string((string *)&local_40,(string *)fmt_str);
  Exception::ConstructMessage<std::__cxx11::string,char_const*>
            (__return_storage_ptr__,(Exception *)this,&local_40,params,params_1);
  ::std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

static string Format(const string fmt_str, ARGS... params) {
		return Exception::ConstructMessage(fmt_str, params...);
	}